

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
duckdb_fmt::v6::internal::format_uint<4u,wchar_t,unsigned__int128>
          (internal *this,wchar_t *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  undefined4 in_register_00000014;
  internal *piVar3;
  int in_R8D;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  lVar4 = (long)(int)CONCAT71(in_register_00000009,upper);
  if (in_R8D == 0) {
    pcVar2 = "0123456789abcdef";
  }
  else {
    pcVar2 = "0123456789ABCDEF";
  }
  piVar3 = this + lVar4 * 4;
  uVar5 = CONCAT44(in_register_00000014,num_digits);
  do {
    piVar3 = piVar3 + -4;
    *(int *)piVar3 = (int)pcVar2[(uint)buffer & 0xf];
    bVar6 = (wchar_t *)0xf < buffer;
    bVar7 = uVar5 != 0;
    uVar1 = -uVar5;
    buffer = (wchar_t *)(uVar5 << 0x3c | (ulong)buffer >> 4);
    uVar5 = uVar5 >> 4;
  } while (bVar7 || uVar1 < bVar6);
  return (wchar_t *)(this + lVar4 * 4);
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}